

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::Print<std::__cxx11::string>
               (FILE *fp,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  array<char,_4UL> fmt;
  char local_c [4];
  
  builtin_strncpy(local_c,"%s\n",4);
  fprintf((FILE *)fp,local_c,(args->_M_dataplus)._M_p);
  fflush((FILE *)fp);
  return;
}

Assistant:

void Print(FILE* fp, Args&& ...args)
{
	constexpr auto t = detail::GetOptions<std::decay_t<Args>...>();
	constexpr auto d = std::get<0>(t);
	constexpr auto e = std::get<1>(t);
	constexpr auto f = std::get<2>(t);
	constexpr size_t n = std::get<3>(t).value;
	constexpr auto fmt = detail::MakeFormatStr<decltype(d), decltype(e), GetFrontTypesT<n, std::decay_t<Args>...>>::apply();
	Apply(&fprintf, std::tuple_cat(std::make_tuple(fp), std::make_tuple(fmt.data()), GetFrontArgs<n>(detail::ConvStringToCharPtr(std::forward<Args>(args))...)));
	detail::Flush<decltype(f)>(fp);
}